

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::notify_new_savept(CVmObjTable *this)

{
  CVmObjPageEntry *pCVar1;
  size_t sVar2;
  long lVar3;
  CVmObjPageEntry **ppCVar4;
  
  sVar2 = this->pages_used_;
  if (sVar2 != 0) {
    ppCVar4 = this->pages_;
    do {
      pCVar1 = *ppCVar4;
      lVar3 = 0;
      do {
        if ((*(ushort *)(&pCVar1->field_0x14 + lVar3) & 1) == 0) {
          *(ushort *)(&pCVar1->field_0x14 + lVar3) = *(ushort *)(&pCVar1->field_0x14 + lVar3) | 0x40
          ;
          (**(code **)(*(long *)((long)&pCVar1->ptr_ + lVar3) + 0x98))((long)&pCVar1->ptr_ + lVar3);
        }
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0x18000);
      ppCVar4 = ppCVar4 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void CVmObjTable::notify_new_savept()
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;

    /* go through each page of objects */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* go through each entry on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* if this entry is active, tell it about the new savepoint */
            if (!entry->free_)
            {
                /* 
                 *   the object existed at the start of this savepoint, so
                 *   it must keep undo information throughout the savepoint 
                 */
                entry->in_undo_ = TRUE;
                
                /* notify the object of the new savepoint */
                entry->get_vm_obj()->notify_new_savept();
            }
        }
    }
}